

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::TestKeyOwner(ImGuiKey key,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiKeyOwnerData *pIVar2;
  bool bVar3;
  
  bVar1 = IsNamedKeyOrModKey(key);
  bVar3 = true;
  if (bVar1) {
    if ((((GImGui->ActiveIdUsingAllKeyboardKeys == true) && (key - ImGuiKey_NamedKey_BEGIN < 0x69))
        && (owner_id != 0)) && (GImGui->ActiveId != owner_id)) {
      bVar3 = false;
    }
    else {
      pIVar2 = GetKeyOwnerData(key);
      if (owner_id == 0) {
        bVar3 = pIVar2->LockThisFrame == false;
      }
      else if ((pIVar2->OwnerCurr == owner_id) ||
              ((bVar3 = false, pIVar2->OwnerCurr == 0xffffffff && (pIVar2->LockThisFrame == false)))
              ) {
        bVar3 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::TestKeyOwner(ImGuiKey key, ImGuiID owner_id)
{
    if (!IsNamedKeyOrModKey(key))
        return true;

    ImGuiContext& g = *GImGui;
    if (g.ActiveIdUsingAllKeyboardKeys && owner_id != g.ActiveId && owner_id != ImGuiKeyOwner_Any)
        if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
            return false;

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    if (owner_id == ImGuiKeyOwner_Any)
        return (owner_data->LockThisFrame == false);

    // Note: SetKeyOwner() sets OwnerCurr. It is not strictly required for most mouse routing overlap (because of ActiveId/HoveredId
    // are acting as filter before this has a chance to filter), but sane as soon as user tries to look into things.
    // Setting OwnerCurr in SetKeyOwner() is more consistent than testing OwnerNext here: would be inconsistent with getter and other functions.
    if (owner_data->OwnerCurr != owner_id)
    {
        if (owner_data->LockThisFrame)
            return false;
        if (owner_data->OwnerCurr != ImGuiKeyOwner_None)
            return false;
    }

    return true;
}